

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbifnet.cpp
# Opt level: O0

void __thiscall HttpReqThread::thread_main(HttpReqThread *this)

{
  int iVar1;
  long *plVar2;
  CVmDataSource *reply_00;
  long in_RDI;
  int status;
  size_t hdrs_len;
  char *in_stack_00000068;
  int rflags;
  char *reply_hdrs;
  char *in_stack_00000078;
  unsigned_short in_stack_00000086;
  CVmMemorySource *reply;
  char **locp;
  char *loc;
  OS_HttpPayload *in_stack_000000a8;
  CVmDataSource *in_stack_000000b0;
  char **in_stack_000000b8;
  char **in_stack_000000c0;
  char *in_stack_000000c8;
  long in_stack_ffffffffffffff58;
  CVmMemorySource *in_stack_ffffffffffffff60;
  char *loc_00;
  long *in_stack_ffffffffffffff68;
  long *plVar3;
  int status_00;
  HttpReqThread *this_00;
  _func_int **local_30;
  
  local_30 = (_func_int **)0x0;
  if ((*(uint *)(in_RDI + 0x50) & 1) == 0) {
    this_00 = (HttpReqThread *)0x0;
  }
  else {
    this_00 = (HttpReqThread *)&stack0xffffffffffffffd0;
  }
  plVar2 = (long *)operator_new(0x10);
  CVmMemorySource::CVmMemorySource(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  plVar3 = plVar2;
  if (*(long *)(in_RDI + 0x78) == 0) {
    reply_00 = (CVmDataSource *)0x0;
  }
  else {
    reply_00 = (CVmDataSource *)strlen(*(char **)(in_RDI + 0x78));
  }
  status_00 = (int)((ulong)plVar3 >> 0x20);
  loc_00 = (char *)0x0;
  iVar1 = OS_HttpClient::request
                    ((int)locp,(char *)reply,in_stack_00000086,in_stack_00000078,reply_hdrs,
                     in_stack_00000068,(size_t)this,in_stack_000000a8,in_stack_000000b0,
                     in_stack_000000b8,in_stack_000000c0,in_stack_000000c8);
  if ((iVar1 < 0) && (in_stack_ffffffffffffff68 = plVar2, plVar2 != (long *)0x0)) {
    (**(code **)(*plVar2 + 8))();
    in_stack_ffffffffffffff68 = plVar2;
  }
  post_result(this_00,status_00,reply_00,(char *)in_stack_ffffffffffffff68,loc_00);
  return;
}

Assistant:

void thread_main()
    {
        /* if they want redirections, set up to receive the location */
        char *loc = 0;
        char **locp = ((options & NetReqNoRedirect) != 0 ? &loc : 0);

        /* set up a memory stream object to hold the reply */
        CVmMemorySource *reply = new CVmMemorySource(128);

        /* no reply headers yet */
        char *reply_hdrs = 0;

        /* figure the request option flags */
        int rflags = 0;
        if (https)
            rflags |= OS_HttpClient::OptHTTPS;

        /* get the length of the custom headers, if we have any */
        size_t hdrs_len = (hdrs != 0 ? strlen(hdrs) : 0);

        /* send the request */
        int status = OS_HttpClient::request(
            rflags, host, port, verb, resource, hdrs, hdrs_len, body,
            reply, &reply_hdrs, locp, 0);
        
        /* 
         *   if the status is negative, a system-level error occurred, so
         *   there's no reply data - delete and forget the reply stream
         */
        if (status < 0)
        {
            delete reply;
            reply = 0;
        }
        
        /* 
         *   Always post a result event, even on failure, since the event is
         *   the way we transmit the status information back to the caller.
         *   Note that the event object takes ownership of the reply stream,
         *   headers string, and location string, and will free the
         *   underlying memory when the event object is deleted.
         */
        post_result(status, reply, reply_hdrs, loc);
    }